

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map.h
# Opt level: O0

void __thiscall
CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::rehash
          (unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_> *this,size_t n)

{
  size_t sVar1;
  bool bVar2;
  size_type sVar3;
  unsigned_long *puVar4;
  reference __x;
  float fVar5;
  float fVar6;
  pair<CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::hashtable_iterator,_bool>
  local_c8;
  reference local_a8;
  pair<int,_int> *val_1;
  iterator __end0_1;
  iterator __begin0_1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range2_1;
  ValueT *val;
  iterator __end0;
  undefined1 local_58 [8];
  iterator __begin0;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_> *__range2;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> tmp;
  size_t local_18;
  size_t n_local;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_> *this_local;
  
  local_18 = n;
  n_local = (size_t)this;
  fVar5 = load_factor(this);
  fVar6 = max_load_factor(this);
  sVar1 = local_18;
  if ((fVar6 <= fVar5) ||
     (sVar3 = std::
              vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
              ::size(&this->mBuckets), sVar3 < sVar1)) {
    sVar3 = std::
            vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
            ::size(&this->mBuckets);
    tmp.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)(sVar3 * 2);
    puVar4 = std::max<unsigned_long>
                       (&local_18,
                        (unsigned_long *)
                        &tmp.
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_18 = *puVar4;
    puVar4 = std::lower_bound<unsigned_long_const*,unsigned_long>
                       ((unsigned_long *)PRIMES,(unsigned_long *)&__GNU_EH_FRAME_HDR,&local_18);
    local_18 = *puVar4;
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&__range2);
    __begin0.mEndBucketItr._M_current =
         (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)this;
    begin((iterator *)local_58,this);
    end((iterator *)&val,
        (unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_> *)
        __begin0.mEndBucketItr._M_current);
    while (bVar2 = hashtable_iterator::operator!=
                             ((hashtable_iterator *)local_58,(hashtable_iterator *)&val), bVar2) {
      __x = hashtable_iterator::operator*((hashtable_iterator *)local_58);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&__range2,__x
                );
      hashtable_iterator::operator++((hashtable_iterator *)local_58);
    }
    clear(this);
    std::
    vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
    ::resize(&this->mBuckets,local_18);
    __end0_1 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                         ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          &__range2);
    val_1 = (pair<int,_int> *)
            std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                      ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                       &__range2);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end0_1,
                              (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                               *)&val_1), bVar2) {
      local_a8 = __gnu_cxx::
                 __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                 ::operator*(&__end0_1);
      insert(&local_c8,this,local_a8);
      __gnu_cxx::
      __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
      ::operator++(&__end0_1);
    }
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&__range2);
  }
  return;
}

Assistant:

void rehash(size_t n) {
      if (load_factor() < max_load_factor() && n <= mBuckets.size()) return;
      n = std::max(n, mBuckets.size()*2);
      n = *std::lower_bound(PRIMES,PRIMES+N_PRIMES,n);

      std::vector<ValueT> tmp;
      for (auto& val : *this) {
        tmp.push_back(val);
      }
      this->clear();
      mBuckets.resize(n);
      for (auto& val : tmp) {
        this->insert(val);
      }
    }